

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poolresourcetester.h
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
PoolResourceTester::FreeListSizes<8ul,8ul>
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          PoolResourceTester *this,PoolResource<8UL,_8UL> *resource)

{
  iterator __position;
  long *plVar1;
  long lVar2;
  long in_FS_OFFSET;
  unsigned_long local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = 0x20;
  do {
    plVar1 = *(long **)(this + lVar2);
    local_30 = 0;
    if (plVar1 != (long *)0x0) {
      local_30 = 0;
      do {
        local_30 = local_30 + 1;
        plVar1 = (long *)*plVar1;
      } while (plVar1 != (long *)0x0);
    }
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)__return_storage_ptr__,
                 __position,&local_30);
    }
    else {
      *__position._M_current = local_30;
      (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
      _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x30);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::size_t> FreeListSizes(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES>& resource)
    {
        auto sizes = std::vector<std::size_t>();
        for (const auto* ptr : resource.m_free_lists) {
            size_t size = 0;
            while (ptr != nullptr) {
                ++size;
                ptr = ptr->m_next;
            }
            sizes.push_back(size);
        }
        return sizes;
    }